

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_lib.c
# Opt level: O0

int RSA_get0_multi_prime_crt_params(RSA *r,BIGNUM **exps,BIGNUM **coeffs)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  int i;
  RSA_PRIME_INFO *pinfo;
  int pnum;
  int idx;
  RSA *in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar1 = RSA_get_multi_prime_extra_count(in_stack_ffffffffffffffd0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if ((in_RSI != 0) || (in_RDX != 0)) {
      for (idx = 0; idx < iVar1; idx = idx + 1) {
        in_stack_ffffffffffffffd0 =
             (RSA *)sk_RSA_PRIME_INFO_value
                              ((stack_st_RSA_PRIME_INFO *)in_stack_ffffffffffffffd0,idx);
        if (in_RSI != 0) {
          *(OSSL_LIB_CTX **)(in_RSI + (long)idx * 8) = in_stack_ffffffffffffffd0->libctx;
        }
        if (in_RDX != 0) {
          *(BIGNUM **)(in_RDX + (long)idx * 8) = *(BIGNUM **)&in_stack_ffffffffffffffd0->version;
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int RSA_get0_multi_prime_crt_params(const RSA *r, const BIGNUM *exps[],
                                    const BIGNUM *coeffs[])
{
    int pnum;

    if ((pnum = RSA_get_multi_prime_extra_count(r)) == 0)
        return 0;

    /* return other primes */
    if (exps != NULL || coeffs != NULL) {
        RSA_PRIME_INFO *pinfo;
        int i;

        /* it's the user's job to guarantee the buffer length */
        for (i = 0; i < pnum; i++) {
            pinfo = sk_RSA_PRIME_INFO_value(r->prime_infos, i);
            if (exps != NULL)
                exps[i] = pinfo->d;
            if (coeffs != NULL)
                coeffs[i] = pinfo->t;
        }
    }

    return 1;
}